

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

void __thiscall
inja::Parser::Parser
          (Parser *this,ParserConfig *parser_config,LexerConfig *lexer_config,
          TemplateStorage *included_templates)

{
  ParserStatic *pPVar1;
  TemplateStorage *included_templates_local;
  LexerConfig *lexer_config_local;
  ParserConfig *parser_config_local;
  Parser *this_local;
  
  this->m_config = parser_config;
  Lexer::Lexer(&this->m_lexer,lexer_config);
  Token::Token(&this->m_tok);
  Token::Token(&this->m_peek_tok);
  this->m_have_peek_tok = false;
  this->m_included_templates = included_templates;
  pPVar1 = ParserStatic::get_instance();
  this->m_static = pPVar1;
  std::vector<inja::Parser::IfData,_std::allocator<inja::Parser::IfData>_>::vector
            (&this->m_if_stack);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_loop_stack);
  return;
}

Assistant:

explicit Parser(const ParserConfig& parser_config, const LexerConfig& lexer_config,
					TemplateStorage& included_templates)
		: m_config(parser_config),
		  m_lexer(lexer_config),
		  m_included_templates(included_templates),
		  m_static(ParserStatic::get_instance()) {}